

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kxsort.h
# Opt level: O0

void kx::
     radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,2>
               (uint *s,uint *e)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  reference puVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *local_10b0;
  int local_1074;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_1070;
  int i_3;
  int local_1068;
  uint local_1064;
  int tag;
  uint swapper;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> end;
  int i_2;
  int local_1044;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_1040;
  int i_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> i;
  size_t count [256];
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *last
  ;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  last_ [257];
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  e_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  s_local;
  
  local_10b0 = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)&last;
  local_18._M_current = e;
  e_local._M_current = s;
  do {
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    __normal_iterator(local_10b0);
    local_10b0 = local_10b0 + 1;
  } while (local_10b0 != last_ + 0x100);
  memset(&i,0,0x800);
  _Stack_1040._M_current = e_local._M_current;
  while (bVar2 = __gnu_cxx::operator<(&stack0xffffffffffffefc0,&local_18), bVar2) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&stack0xffffffffffffefc0);
    iVar3 = RadixTraitsUnsigned<unsigned_int>::kth_byte
                      ((RadixTraitsUnsigned<unsigned_int> *)((long)&last_[0x100]._M_current + 7),
                       puVar5,2);
    count[(long)iVar3 + -1] = count[(long)iVar3 + -1] + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&stack0xffffffffffffefc0);
  }
  last_[0] = e_local;
  last = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          *)e_local._M_current;
  for (local_1044 = 1; local_1044 < 0x100; local_1044 = local_1044 + 1) {
    _Var4 = __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator+(last_ + (local_1044 + -1),count[(long)(local_1044 + -1) + -1]);
    last_[local_1044]._M_current = _Var4._M_current;
  }
  end._M_current._4_4_ = 0;
  do {
    if (0xff < end._M_current._4_4_) {
LAB_00104c2b:
      for (local_1074 = 0; local_1074 < 0x100; local_1074 = local_1074 + 1) {
        if (count[(long)local_1074 + -1] < 0x41) {
          if (1 < count[(long)local_1074 + -1]) {
            insert_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>>
                      (last_[local_1074 + -1]._M_current,last_[local_1074]._M_current);
          }
        }
        else {
          radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,1>
                    (last_[local_1074 + -1]._M_current,last_[local_1074]._M_current);
        }
      }
      return;
    }
    _tag = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator+(last_ + (end._M_current._4_4_ + -1),count[(long)end._M_current._4_4_ + -1]);
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&tag,&local_18);
    if (bVar2) {
      last_[end._M_current._4_4_]._M_current = local_18._M_current;
      goto LAB_00104c2b;
    }
    while (bVar2 = __gnu_cxx::operator!=
                             (last_ + end._M_current._4_4_,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&tag), bVar2) {
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(last_ + end._M_current._4_4_);
      local_1064 = *puVar5;
      local_1068 = RadixTraitsUnsigned<unsigned_int>::kth_byte
                             ((RadixTraitsUnsigned<unsigned_int> *)
                              ((long)&last_[0x100]._M_current + 7),&local_1064,2);
      if (local_1068 != end._M_current._4_4_) {
        do {
          _Stack_1070 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator++(last_ + local_1068,0);
          puVar5 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&stack0xffffffffffffef90);
          std::swap<unsigned_int>(&local_1064,puVar5);
          local_1068 = RadixTraitsUnsigned<unsigned_int>::kth_byte
                                 ((RadixTraitsUnsigned<unsigned_int> *)
                                  ((long)&last_[0x100]._M_current + 7),&local_1064,2);
          uVar1 = local_1064;
        } while (local_1068 != end._M_current._4_4_);
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(last_ + end._M_current._4_4_);
        *puVar5 = uVar1;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(last_ + end._M_current._4_4_);
    }
    end._M_current._4_4_ = end._M_current._4_4_ + 1;
  } while( true );
}

Assistant:

inline void radix_sort_core_(RandomIt s, RandomIt e, RadixTraits radix_traits)
    {
        RandomIt last_[kRadixBin + 1];
        RandomIt *last = last_ + 1;
        size_t count[kRadixBin] = {0};

        for (RandomIt i = s; i < e; ++i) {
            ++count[radix_traits.kth_byte(*i, kWhichByte)];
        }

        last_[0] = last_[1] = s;

        for (int i = 1; i < kRadixBin; ++i) {
            last[i] = last[i-1] + count[i-1];
        }

        for (int i = 0; i < kRadixBin; ++i) {
            RandomIt end = last[i-1] + count[i];
            if (end == e) { last[i] = e; break; }
            while (last[i] != end) {
                ValueType swapper = *last[i];
                int tag = radix_traits.kth_byte(swapper, kWhichByte);
                if (tag != i) {
                    do {
                        std::swap(swapper, *last[tag]++);
                    } while ((tag = radix_traits.kth_byte(swapper, kWhichByte)) != i);
                    *last[i] = swapper;
                }
                ++last[i];
            }
        }

        if (kWhichByte > 0) {
            for (int i = 0; i < kRadixBin; ++i) {
                if (count[i] > kInsertSortThreshold) {
                    radix_sort_core_<RandomIt, ValueType, RadixTraits,
                            (kWhichByte > 0 ? (kWhichByte - 1) : 0)>
                            (last[i-1], last[i], radix_traits);
                } else if (count[i] > 1) {
                    insert_sort_core_<RandomIt, ValueType, RadixTraits>(last[i-1], last[i], radix_traits);
                }
            }
        }
    }